

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# print.h
# Opt level: O0

void pbrt::detail::
     stringPrintfRecursive<bool_const&,bool_const&,float_const&,float_const&,float_const&,float_const&,float_const&,float_const&>
               (string *s,char *fmt,bool *v,bool *args,float *args_1,float *args_2,float *args_3,
               float *args_4,float *args_5,float *args_6)

{
  long lVar1;
  ulong uVar2;
  bool *v_00;
  char *in_RCX;
  string *in_RDX;
  float *unaff_RBX;
  char *pcVar3;
  string *in_RDI;
  bool *in_R8;
  float *in_R9;
  float *unaff_R14;
  float *unaff_retaddr;
  bool *in_stack_00000008;
  bool *in_stack_00000010;
  string *in_stack_00000018;
  char *in_stack_00000020;
  stringstream ss;
  bool isDFmt;
  bool isSFmt;
  bool precisionViaArg;
  string nextFmt;
  string *in_stack_fffffffffffffd60;
  char **in_stack_fffffffffffffd68;
  char **in_stack_fffffffffffffd70;
  float *in_stack_fffffffffffffd78;
  float *in_stack_fffffffffffffd80;
  float *in_stack_fffffffffffffd88;
  float *in_stack_fffffffffffffd90;
  string local_268 [32];
  undefined8 local_248;
  string local_240 [24];
  char *in_stack_fffffffffffffdd8;
  stringstream local_220 [4];
  int in_stack_fffffffffffffde4;
  char *in_stack_fffffffffffffde8;
  undefined1 local_210 [4];
  LogLevel in_stack_fffffffffffffdf4;
  string local_98 [32];
  undefined4 local_78;
  undefined1 local_63;
  byte local_62;
  byte local_61;
  string local_60 [16];
  float *in_stack_ffffffffffffffb0;
  float *in_stack_ffffffffffffffb8;
  
  copyToFormatString(in_stack_fffffffffffffd68,in_stack_fffffffffffffd60);
  lVar1 = std::__cxx11::string::find((char)local_60,0x2a);
  local_61 = lVar1 != -1;
  lVar1 = std::__cxx11::string::find((char)local_60,0x73);
  local_62 = lVar1 != -1;
  lVar1 = std::__cxx11::string::find((char)local_60,100);
  local_63 = lVar1 != -1;
  if ((local_61 & 1) == 0) {
    if ((local_62 & 1) == 0) {
      if ((bool)local_63) {
        uVar2 = std::__cxx11::string::find((char)local_60,100);
        v_00 = (bool *)IntegerFormatTrait<bool>::fmt();
        std::__cxx11::string::replace((ulong)local_60,uVar2,(char *)0x1);
        std::__cxx11::string::c_str();
        formatOne<bool_const&>((char *)in_stack_fffffffffffffd78,v_00);
        std::__cxx11::string::operator+=(in_RDI,local_98);
        std::__cxx11::string::~string(local_98);
      }
      else if ((local_62 & 1) == 0) {
        uVar2 = std::__cxx11::string::empty();
        if ((uVar2 & 1) != 0) {
          LogFatal(in_stack_fffffffffffffdf4,in_stack_fffffffffffffde8,in_stack_fffffffffffffde4,
                   in_stack_fffffffffffffdd8);
        }
        std::__cxx11::string::c_str();
        formatOne<bool_const&>((char *)in_stack_fffffffffffffd78,(bool *)in_stack_fffffffffffffd70);
        std::__cxx11::string::operator+=(in_RDI,(string *)&stack0xfffffffffffffd78);
        std::__cxx11::string::~string((string *)&stack0xfffffffffffffd78);
      }
      else {
        std::__cxx11::stringstream::stringstream(local_220);
        std::ostream::operator<<(local_210,(bool)((byte)in_RDX->_M_dataplus & 1));
        std::__cxx11::string::c_str();
        std::__cxx11::stringstream::str();
        local_248 = std::__cxx11::string::c_str();
        formatOne<char_const*>((char *)in_stack_fffffffffffffd78,in_stack_fffffffffffffd70);
        std::__cxx11::string::operator+=(in_RDI,local_240);
        std::__cxx11::string::~string(local_240);
        std::__cxx11::string::~string(local_268);
        std::__cxx11::stringstream::~stringstream(local_220);
      }
    }
    else {
      pcVar3 = "false";
      if (((byte)in_RDX->_M_dataplus & 1) != 0) {
        pcVar3 = "true";
      }
      std::__cxx11::string::operator+=(in_RDI,pcVar3);
    }
    stringPrintfRecursive<bool_const&,float_const&,float_const&,float_const&,float_const&,float_const&,float_const&>
              (in_RDX,in_RCX,in_R8,in_R9,in_stack_ffffffffffffffb8,in_stack_ffffffffffffffb0,
               unaff_RBX,unaff_R14,unaff_retaddr);
    local_78 = 0;
  }
  else {
    stringPrintfRecursiveWithPrecision<bool_const&,bool_const&,float_const&,float_const&,float_const&,float_const&,float_const&,float_const&>
              (in_stack_fffffffffffffd60,in_stack_00000020,in_stack_00000018,in_stack_00000010,
               in_stack_00000008,in_R9,(float *)in_stack_fffffffffffffd70,in_stack_fffffffffffffd78,
               in_stack_fffffffffffffd80,in_stack_fffffffffffffd88,in_stack_fffffffffffffd90);
    local_78 = 1;
  }
  std::__cxx11::string::~string(local_60);
  return;
}

Assistant:

inline void stringPrintfRecursive(std::string *s, const char *fmt, T &&v,
                                  Args &&... args) {
    std::string nextFmt = copyToFormatString(&fmt, s);
    bool precisionViaArg = nextFmt.find('*') != std::string::npos;

    bool isSFmt = nextFmt.find('s') != std::string::npos;
    bool isDFmt = nextFmt.find('d') != std::string::npos;

    if constexpr (std::is_integral<std::decay_t<T>>::value) {
        if (precisionViaArg) {
            stringPrintfRecursiveWithPrecision(s, fmt, nextFmt, v,
                                               std::forward<Args>(args)...);
            return;
        }
    } else if (precisionViaArg)
        LOG_FATAL("Non-integral type provided for %* format.");

    if constexpr (std::is_same<std::decay_t<T>, float>::value)
        if (nextFmt == "%f" || nextFmt == "%s") {
            *s += detail::FloatToString(v);
            goto done;
        }

    if constexpr (std::is_same<std::decay_t<T>, double>::value)
        if (nextFmt == "%f" || nextFmt == "%s") {
            *s += detail::DoubleToString(v);
            goto done;
        }

    if constexpr (std::is_same<std::decay_t<T>, bool>::value)  // FIXME: %-10s with bool
        if (isSFmt) {
            *s += bool(v) ? "true" : "false";
            goto done;
        }

    if constexpr (std::is_integral<std::decay_t<T>>::value) {
        if (isDFmt) {
            nextFmt.replace(nextFmt.find('d'), 1,
                            detail::IntegerFormatTrait<std::decay_t<T>>::fmt());
            *s += formatOne(nextFmt.c_str(), std::forward<T>(v));
            goto done;
        }
    } else if (isDFmt)
        LOG_FATAL("Non-integral type passed to %d format.");

    if (isSFmt) {
        std::stringstream ss;
        ss << v;
        *s += formatOne(nextFmt.c_str(), ss.str().c_str());
    } else if (!nextFmt.empty())
        *s += formatOne(nextFmt.c_str(), std::forward<T>(v));
    else
        LOG_FATAL("Excess values passed to Printf.");

done:
    stringPrintfRecursive(s, fmt, std::forward<Args>(args)...);
}